

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

Reg __thiscall backend::codegen::Codegen::translate_value_to_reg(Codegen *this,Value *v)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  VarId *pVVar4;
  undefined8 *puVar5;
  void *__s;
  Reg rd;
  Reg reg_1;
  VarId *x_1;
  uint32_t imm_u;
  Reg reg;
  int int_value;
  int *x;
  VarId *in_stack_000000d0;
  Codegen *in_stack_000000d8;
  undefined2 in_stack_ffffffffffffff28;
  uint8_t in_stack_ffffffffffffff2a;
  RegisterShiftKind in_stack_ffffffffffffff2b;
  Reg in_stack_ffffffffffffff2c;
  Value *in_stack_ffffffffffffff30;
  UnreachableException *this_00;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *in_stack_ffffffffffffff38;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *in_stack_ffffffffffffff40;
  RegisterOperand *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar6;
  OpCode *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  Reg local_4;
  
  piVar3 = mir::inst::Value::get_if<int>((Value *)0x2159d1);
  if (piVar3 == (int *)0x0) {
    pVVar4 = mir::inst::Value::get_if<mir::inst::VarId>((Value *)0x215a4c);
    if (pVVar4 == (VarId *)0x0) {
      this_00 = (UnreachableException *)0x8;
      puVar5 = (undefined8 *)__cxa_allocate_exception();
      __s = operator_new((ulong)this_00);
      memset(__s,0,8);
      prelude::UnreachableException::UnreachableException(this_00);
      *puVar5 = __s;
      __cxa_throw(puVar5,&prelude::UnreachableException*::typeinfo,0);
    }
    mir::inst::VarId::VarId
              ((VarId *)in_stack_ffffffffffffff30,
               (VarId *)CONCAT44(in_stack_ffffffffffffff2c,
                                 CONCAT13(in_stack_ffffffffffffff2b,
                                          CONCAT12(in_stack_ffffffffffffff2a,
                                                   in_stack_ffffffffffffff28))));
    local_4 = get_or_alloc_vgp(in_stack_000000d8,in_stack_000000d0);
    bVar2 = mir::inst::Value::has_shift(in_stack_ffffffffffffff30);
    if (bVar2) {
      local_4 = alloc_vgp((Codegen *)0x215ab1);
      uVar6 = 6;
      arm::RegisterOperand::RegisterOperand
                ((RegisterOperand *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff2b,in_stack_ffffffffffffff2a);
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int&,arm::RegisterOperand>
                (in_stack_ffffffffffffff98,(uint *)CONCAT44(uVar6,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_ffffffffffffff30,
                  (value_type *)
                  CONCAT44(in_stack_ffffffffffffff2c,
                           CONCAT13(in_stack_ffffffffffffff2b,
                                    CONCAT12(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28))))
      ;
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                (in_stack_ffffffffffffff40);
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                 in_stack_ffffffffffffff30);
    }
  }
  else {
    iVar1 = *piVar3;
    local_4 = alloc_vgp((Codegen *)0x2159ff);
    make_number((Codegen *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                (Reg)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(uint32_t)in_stack_ffffffffffffffc8)
    ;
  }
  return local_4;
}

Assistant:

arm::Reg Codegen::translate_value_to_reg(mir::inst::Value& v) {
  if (auto x = v.get_if<int32_t>()) {
    auto int_value = *x;
    auto reg = alloc_vgp();
    uint32_t imm_u = int_value;
    make_number(reg, imm_u);
    return reg;
  } else if (auto x = v.get_if<mir::inst::VarId>()) {
    auto reg = get_or_alloc_vgp(*x);
    if (v.has_shift()) {
      auto rd = alloc_vgp();
      inst.push_back(std::make_unique<Arith2Inst>(
          OpCode::Mov, rd, RegisterOperand(reg, v.shift, v.shift_amount)));
      return rd;
    } else {
      return reg;
    }
  } else {
    throw new prelude::UnreachableException();
  }
}